

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea_io.c
# Opt level: O3

int CVodeGetAdjCheckPointsInfo(void *cvode_mem,CVadjCheckPointRec *ckpnt)

{
  sunrealtype *psVar1;
  sunrealtype sVar2;
  sunrealtype *psVar3;
  int line;
  int iVar4;
  int error_code;
  sunrealtype *psVar5;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar4 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x276;
  }
  else {
    if (*(int *)((long)cvode_mem + 0xa78) != 0) {
      psVar3 = *(sunrealtype **)(*(long *)((long)cvode_mem + 0xa70) + 0x50);
      if (psVar3 == (sunrealtype *)0x0) {
        return 0;
      }
      psVar5 = &ckpnt->step;
      do {
        ((CVadjCheckPointRec *)(psVar5 + -6))->my_addr = psVar3;
        psVar1 = (sunrealtype *)psVar3[0x66];
        psVar5[-5] = (sunrealtype)psVar1;
        sVar2 = psVar3[1];
        psVar5[-4] = *psVar3;
        psVar5[-3] = sVar2;
        psVar5[-2] = psVar3[0x3a];
        *(int *)(psVar5 + -1) = *(int *)(psVar3 + 0x3c);
        *psVar5 = psVar3[0x3f];
        psVar5 = psVar5 + 7;
        psVar3 = psVar1;
      } while (psVar1 != (sunrealtype *)0x0);
      return 0;
    }
    msgfmt = "Illegal attempt to call before calling CVodeAdjMalloc.";
    iVar4 = -0x65;
    error_code = -0x65;
    line = 0x27e;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetAdjCheckPointsInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea_io.c"
                 ,msgfmt);
  return iVar4;
}

Assistant:

int CVodeGetAdjCheckPointsInfo(void* cvode_mem, CVadjCheckPointRec* ckpnt)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVckpntMem ck_mem;
  int i;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  ck_mem = ca_mem->ck_mem;

  i = 0;

  while (ck_mem != NULL)
  {
    ckpnt[i].my_addr   = (void*)ck_mem;
    ckpnt[i].next_addr = (void*)ck_mem->ck_next;
    ckpnt[i].t0        = ck_mem->ck_t0;
    ckpnt[i].t1        = ck_mem->ck_t1;
    ckpnt[i].nstep     = ck_mem->ck_nst;
    ckpnt[i].order     = ck_mem->ck_q;
    ckpnt[i].step      = ck_mem->ck_h;

    ck_mem = ck_mem->ck_next;
    i++;
  }

  return (CV_SUCCESS);
}